

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSceneSphereBoundMSFT *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  invalid_argument *this;
  long lVar5;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string center_prefix;
  string radius_prefix;
  ostringstream oss_radius;
  XrSceneSphereBoundMSFT *local_248;
  long local_240;
  XrSceneSphereBoundMSFT local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_248 = value;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct((ulong)local_1a8,'\x12');
  *local_1a8[0]._M_dataplus._M_p = '0';
  local_1a8[0]._M_dataplus._M_p[1] = 'x';
  pcVar4 = local_1a8[0]._M_dataplus._M_p + local_1a8[0]._M_string_length + -1;
  lVar5 = 0;
  do {
    bVar1 = *(byte *)((long)&local_248 + lVar5);
    *pcVar4 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar4[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar5 = lVar5 + 1;
    pcVar4 = pcVar4 + -2;
  } while (lVar5 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_248 = &local_238;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_248,(long)&(local_248->center).x + local_240);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_208;
  local_208._0_8_ = local_208 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)gen_dispatch_table_00,"XrVector3f","");
  bVar3 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->center,&local_1e8,(string *)local_208,false,
                     contents);
  if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    pcVar2 = (prefix->_M_dataplus)._M_p;
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,pcVar2,pcVar2 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_228);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<double>((double)value->radius);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&local_228,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238.center._0_8_ + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSceneSphereBoundMSFT* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string center_prefix = prefix;
        center_prefix += "center";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->center, center_prefix, "XrVector3f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        return true;
    } catch(...) {
    }
    return false;
}